

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

int __thiscall crnlib::dxt_image::init(dxt_image *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  long in_RCX;
  uint i;
  uint uVar2;
  task_pool *this_00;
  init_task_params init_params;
  task_pool tmp_pool;
  task_pool local_2f0;
  
  iVar1 = init(this,ctx);
  if ((char)iVar1 == '\0') {
    return 0;
  }
  this_00 = *(task_pool **)(in_RCX + 0x30);
  task_pool::task_pool(&local_2f0);
  if (this_00 == (task_pool *)0x0) {
    this_00 = &local_2f0;
    iVar1 = task_pool::init(this_00,(EVP_PKEY_CTX *)(ulong)*(uint *)(in_RCX + 4));
    if ((char)iVar1 == '\0') {
      iVar1 = 0;
      goto LAB_00175a95;
    }
  }
  crn_get_current_thread_id();
  for (uVar2 = 0; uVar2 <= *(uint *)(in_RCX + 4); uVar2 = uVar2 + 1) {
    task_pool::
    queue_object_task<crnlib::dxt_image,void(crnlib::dxt_image::*)(unsigned_long_long,void*)>
              (this_00,this,0x1751e2,0,(void *)(ulong)uVar2);
  }
  task_pool::join(this_00);
  iVar1 = (int)CONCAT71((int7)((ulong)this_00 >> 8),1);
LAB_00175a95:
  task_pool::~task_pool(&local_2f0);
  return iVar1;
}

Assistant:

bool dxt_image::init(dxt_format fmt, const image_u8& img, const pack_params& p) {
  if (!init(fmt, img.get_width(), img.get_height(), false))
    return false;

#if CRNLIB_SUPPORT_ATI_COMPRESS
  if (p.m_compressor == cCRNDXTCompressorATI)
    return init_ati_compress(fmt, img, p);
#endif

  task_pool* pPool = p.m_pTask_pool;

  task_pool tmp_pool;
  if (!pPool) {
    if (!tmp_pool.init(p.m_num_helper_threads))
      return false;
    pPool = &tmp_pool;
  }

  init_task_params init_params;
  init_params.m_fmt = fmt;
  init_params.m_pImg = &img;
  init_params.m_pParams = &p;
  init_params.m_main_thread = crn_get_current_thread_id();
  init_params.m_canceled = false;

  for (uint i = 0; i <= p.m_num_helper_threads; i++)
    pPool->queue_object_task(this, &dxt_image::init_task, i, &init_params);

  pPool->join();

  if (init_params.m_canceled)
    return false;

  return true;
}